

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-bookmarks.cc
# Opt level: O2

void generate_page_map(QPDF *qpdf)

{
  mapped_type *pmVar1;
  long lVar2;
  int iVar3;
  QPDFObjGen local_68;
  long local_60;
  long local_58;
  QPDFPageDocumentHelper dh;
  
  QPDFPageDocumentHelper::QPDFPageDocumentHelper(&dh,qpdf);
  QPDFPageDocumentHelper::getAllPages();
  iVar3 = 1;
  for (lVar2 = local_60; lVar2 != local_58; lVar2 = lVar2 + 0x38) {
    local_68 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)(lVar2 + 8));
    pmVar1 = std::
             map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
             ::operator[](&page_map,&local_68);
    *pmVar1 = iVar3;
    iVar3 = iVar3 + 1;
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_60);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&dh);
  return;
}

Assistant:

void
generate_page_map(QPDF& qpdf)
{
    QPDFPageDocumentHelper dh(qpdf);
    int n = 0;
    for (auto const& page: dh.getAllPages()) {
        page_map[page] = ++n;
    }
}